

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  Cluster **ppCVar1;
  bool bVar2;
  Cluster **ppCVar3;
  Cluster *pCVar4;
  Cluster **ppCVar5;
  long lVar6;
  Cluster **ppCVar7;
  
  if (-1 < requested_pos) {
    ppCVar3 = this->m_clusters;
    ppCVar1 = ppCVar3 + this->m_clusterCount + this->m_clusterPreloadCount;
    ppCVar5 = ppCVar1;
    ppCVar7 = ppCVar1;
    if (ppCVar3 < ppCVar1) {
      do {
        ppCVar7 = (Cluster **)
                  ((long)ppCVar3 +
                  (((long)ppCVar5 - (long)ppCVar3 >> 3) - ((long)ppCVar5 - (long)ppCVar3 >> 0x3f) &
                  0xfffffffffffffffeU) * 4);
        if (ppCVar1 <= ppCVar7) {
          __assert_fail("k < jj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b0,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        pCVar4 = *ppCVar7;
        if (pCVar4 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b3,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        lVar6 = pCVar4->m_element_start - pCVar4->m_pSegment->m_start;
        if (lVar6 < 0) {
          __assert_fail("pos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ac6,"long long mkvparser::Cluster::GetPosition() const");
        }
        if (lVar6 < requested_pos) {
          ppCVar3 = ppCVar7 + 1;
          ppCVar7 = ppCVar5;
        }
        else if (lVar6 <= requested_pos) {
          return pCVar4;
        }
        ppCVar5 = ppCVar7;
      } while (ppCVar3 < ppCVar7);
    }
    if (ppCVar3 != ppCVar7) {
      __assert_fail("i == j",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8c4,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
    }
    pCVar4 = Cluster::Create(this,-1,requested_pos);
    if (pCVar4 != (Cluster *)0x0) {
      lVar6 = (long)ppCVar7 - (long)this->m_clusters;
      bVar2 = PreloadCluster(this,pCVar4,lVar6 >> 3);
      if (bVar2) {
        if (this->m_clusters == (Cluster **)0x0) {
          __assert_fail("m_clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8d1,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        if (0 < this->m_clusterPreloadCount) {
          if (*(Cluster **)((long)this->m_clusters + lVar6) == pCVar4) {
            return pCVar4;
          }
          __assert_fail("m_clusters[idx] == pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8d3,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        __assert_fail("m_clusterPreloadCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8d2,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
      }
      Cluster::~Cluster(pCVar4);
      operator_delete(pCVar4);
    }
  }
  return (Cluster *)0x0;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}